

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

int MeCab::progress_bar(char *message,size_t current,size_t total)

{
  uint uVar1;
  uint uVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int bar_len;
  int cur_percentage;
  undefined4 uVar5;
  undefined4 uVar8;
  
  uVar5 = (undefined4)((ulong)in_RSI >> 0x20);
  auVar3._8_4_ = uVar5;
  auVar3._0_8_ = in_RSI;
  auVar3._12_4_ = 0x45300000;
  uVar8 = (undefined4)((ulong)in_RDX >> 0x20);
  auVar6._8_4_ = uVar8;
  auVar6._0_8_ = in_RDX;
  auVar6._12_4_ = 0x45300000;
  uVar1 = (uint)((((auVar3._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)in_RSI) - 4503599627370496.0)) * 100.0) /
                ((auVar6._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)in_RDX) - 4503599627370496.0)));
  auVar4._8_4_ = uVar5;
  auVar4._0_8_ = in_RSI;
  auVar4._12_4_ = 0x45300000;
  auVar7._8_4_ = uVar8;
  auVar7._0_8_ = in_RDX;
  auVar7._12_4_ = 0x45300000;
  uVar2 = (uint)((((auVar4._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)in_RSI) - 4503599627370496.0)) *
                 (double)progress_bar::scale) /
                ((auVar7._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)in_RDX) - 4503599627370496.0)));
  if (progress_bar::prev != uVar1) {
    printf("%s: %3d%% |%.*s%*s| ",in_RDI,(ulong)uVar1,(ulong)uVar2,progress_bar::bar,
           (ulong)(progress_bar::scale - uVar2),"");
    if (uVar1 == 100) {
      printf("\n");
    }
    else {
      printf("\r");
    }
    fflush(_stdout);
  }
  progress_bar::prev = uVar1;
  return 1;
}

Assistant:

int progress_bar(const char* message, size_t current, size_t total) {
  static char bar[] = "###########################################";
  static int scale = sizeof(bar) - 1;
  static int prev = 0;

  int cur_percentage  = static_cast<int>(100.0 * current/total);
  int bar_len = static_cast<int>(1.0 * current*scale/total);

  if (prev != cur_percentage) {
    printf("%s: %3d%% |%.*s%*s| ", message, cur_percentage,
           bar_len, bar, scale - bar_len, "");
    if (cur_percentage == 100)
      printf("\n");
    else
      printf("\r");
    fflush(stdout);
  }

  prev = cur_percentage;

  return 1;
}